

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::InternReadFile
          (ColladaLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer ppaVar1;
  pointer ppVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  pointer ppaVar6;
  aiNode *paVar7;
  aiMetadata *paVar8;
  _Base_ptr p_Var9;
  DeadlyImportError *this_00;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  uint index;
  allocator<char> local_369;
  SkeletonMeshBuilder hero;
  ColladaParser parser;
  
  std::__cxx11::string::_M_assign((string *)&this->mFileName);
  std::
  _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::clear(&(this->mMeshIndexByID)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&(this->mMaterialIndexByName)._M_t);
  ppaVar1 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar1) {
    (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1;
  }
  ppaVar1 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar1) {
    (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1;
  }
  ppVar2 = (this->newMats).
           super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->newMats).
      super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->newMats).
    super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  ppaVar3 = (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar3) {
    (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar3;
  }
  ppaVar4 = (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar4) {
    (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar4;
  }
  ppaVar5 = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar5) {
    (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar5;
  }
  ppaVar6 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar6) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar6;
  }
  ColladaParser::ColladaParser(&parser,pIOHandler,pFile);
  if (parser.mRootNode != (Node *)0x0) {
    std::
    vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ::reserve(&this->newMats,
              parser.mMaterialLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->mMeshes,
               parser.mMeshLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::reserve
              (&this->mCameras,
               parser.mCameraLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::reserve
              (&this->mLights,parser.mLightLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    BuildMaterials(this,&parser,extraout_RDX);
    paVar7 = BuildHierarchy(this,&parser,parser.mRootNode);
    pScene->mRootNode = paVar7;
    FillMaterials(this,&parser,extraout_RDX_00);
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = parser.mUnitSize;
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = parser.mUnitSize;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = parser.mUnitSize;
    hero.mFaces.
    super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
    aiMatrix4x4t<float>::operator*=
              (&pScene->mRootNode->mTransformation,(aiMatrix4x4t<float> *)&hero);
    if (this->ignoreUpDirection == false) {
      if (parser.mUpDirection == UP_Z) {
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 1.0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0xbf800000;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
        aiMatrix4x4t<float>::operator*=
                  (&pScene->mRootNode->mTransformation,(aiMatrix4x4t<float> *)&hero);
      }
      else if (parser.mUpDirection == UP_X) {
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0xbf800000;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f800000;
        hero.mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1.0;
        hero.mFaces.
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        hero.mBones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
        aiMatrix4x4t<float>::operator*=
                  (&pScene->mRootNode->mTransformation,(aiMatrix4x4t<float> *)&hero);
      }
    }
    if (parser.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      paVar8 = aiMetadata::Alloc((uint)parser.mAssetMetaData._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      pScene->mMetaData = paVar8;
      index = 0;
      p_Var9 = parser.mAssetMetaData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var9 != &parser.mAssetMetaData._M_t._M_impl.super__Rb_tree_header)
      {
        aiMetadata::Set<aiString>
                  (pScene->mMetaData,index,(string *)(p_Var9 + 1),(aiString *)(p_Var9 + 2));
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        index = index + 1;
      }
    }
    StoreSceneMeshes(this,pScene);
    StoreSceneMaterials(this,pScene);
    StoreSceneTextures(this,pScene);
    StoreSceneLights(this,pScene);
    StoreSceneCameras(this,pScene);
    StoreAnimations(this,pScene,&parser);
    if (pScene->mNumMeshes == 0) {
      if (this->noSkeletonMesh == false) {
        SkeletonMeshBuilder::SkeletonMeshBuilder(&hero,pScene,(aiNode *)0x0,false);
        SkeletonMeshBuilder::~SkeletonMeshBuilder(&hero);
      }
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    }
    ColladaParser::~ColladaParser(&parser);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hero,"Collada: File came out empty. Something is wrong here.",&local_369);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&hero);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColladaLoader::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFileName = pFile;

    // clean all member arrays - just for safety, it should work even if we did not
    mMeshIndexByID.clear();
    mMaterialIndexByName.clear();
    mMeshes.clear();
    mTargetMeshes.clear();
    newMats.clear();
    mLights.clear();
    mCameras.clear();
    mTextures.clear();
    mAnims.clear();

    // parse the input file
    ColladaParser parser(pIOHandler, pFile);


    if( !parser.mRootNode) {
        throw DeadlyImportError( "Collada: File came out empty. Something is wrong here.");
    }

    // reserve some storage to avoid unnecessary reallocs
    newMats.reserve(parser.mMaterialLibrary.size()*2u);
    mMeshes.reserve(parser.mMeshLibrary.size()*2u);

    mCameras.reserve(parser.mCameraLibrary.size());
    mLights.reserve(parser.mLightLibrary.size());

    // create the materials first, for the meshes to find
    BuildMaterials(parser, pScene);

    // build the node hierarchy from it
    pScene->mRootNode = BuildHierarchy(parser, parser.mRootNode);

    // ... then fill the materials with the now adjusted settings
    FillMaterials(parser, pScene);

    // Apply unit-size scale calculation

    pScene->mRootNode->mTransformation *= aiMatrix4x4(parser.mUnitSize, 0,  0,  0,
                                                        0,  parser.mUnitSize,  0,  0,
                                                        0,  0,  parser.mUnitSize,  0,
                                                        0,  0,  0,  1);
    if( !ignoreUpDirection ) {
        // Convert to Y_UP, if different orientation
        if( parser.mUpDirection == ColladaParser::UP_X) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    0, -1,  0,  0,
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0,  0,  0,  1);
        } else if( parser.mUpDirection == ColladaParser::UP_Z) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0, -1,  0,  0,
                    0,  0,  0,  1);
        }
    }

    // Store scene metadata
    if (!parser.mAssetMetaData.empty()) {
        const size_t numMeta(parser.mAssetMetaData.size());
        pScene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>(numMeta));
        size_t i = 0;
        for (auto it = parser.mAssetMetaData.cbegin(); it != parser.mAssetMetaData.cend(); ++it, ++i) {
            pScene->mMetaData->Set(static_cast<unsigned int>(i), (*it).first, (*it).second);
        }
    }

    // store all meshes
    StoreSceneMeshes(pScene);

    // store all materials
    StoreSceneMaterials(pScene);

    // store all textures
    StoreSceneTextures(pScene);

    // store all lights
    StoreSceneLights(pScene);

    // store all cameras
    StoreSceneCameras(pScene);

    // store all animations
    StoreAnimations(pScene, parser);

    // If no meshes have been loaded, it's probably just an animated skeleton.
    if ( 0u == pScene->mNumMeshes) {

        if (!noSkeletonMesh) {
            SkeletonMeshBuilder hero(pScene);
        }
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}